

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_acceptLanguageCompare(void *param_1,void *a,void *b)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  _acceptLangItem *bb;
  _acceptLangItem *aa;
  
  fVar1 = *b;
  fVar2 = *a;
  uVar3 = 0xffffffff;
  if (fVar2 <= fVar1) {
    uVar3 = (uint)(fVar2 < fVar1);
  }
  if (fVar1 != fVar2) {
    return uVar3;
  }
  iVar4 = uprv_stricmp_63((char *)((long)a + 8),(char *)((long)b + 8));
  return iVar4;
}

Assistant:

static int32_t U_CALLCONV
uloc_acceptLanguageCompare(const void * /*context*/, const void *a, const void *b)
{
    const _acceptLangItem *aa = (const _acceptLangItem*)a;
    const _acceptLangItem *bb = (const _acceptLangItem*)b;

    int32_t rc = 0;
    if(bb->q < aa->q) {
        rc = -1;  /* A > B */
    } else if(bb->q > aa->q) {
        rc = 1;   /* A < B */
    } else {
        rc = 0;   /* A = B */
    }

    if(rc==0) {
        rc = uprv_stricmp(aa->locale, bb->locale);
    }

#if defined(ULOC_DEBUG)
    /*  fprintf(stderr, "a:[%s:%g], b:[%s:%g] -> %d\n",
    aa->locale, aa->q,
    bb->locale, bb->q,
    rc);*/
#endif

    return rc;
}